

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O0

bool __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,StructBegin sb,Range *input)

{
  string_view str;
  bool bVar1;
  ToStringVisitor *in_RDI;
  OstreamBuffer *in_stack_00000010;
  char *in_stack_00000018;
  OstreamBuffer *in_stack_00000020;
  Range *in_stack_00000288;
  OstreamBuffer *in_stack_00000290;
  PrettyPrinter *in_stack_00000298;
  StructBegin in_stack_000002b0;
  OstreamBuffer *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  OstreamBuffer *in_stack_ffffffffffffff90;
  
  comma((ToStringVisitor *)in_stack_ffffffffffffff80);
  if (in_RDI->_pp != (PrettyPrinter *)0x0) {
    in_stack_ffffffffffffff88 = SUB87(in_stack_00000018,0);
    in_stack_ffffffffffffff8f = (char)((ulong)in_stack_00000018 >> 0x38);
    bVar1 = PrettyPrinter::printStruct
                      (in_stack_00000298,in_stack_00000290,in_stack_000002b0,in_stack_00000288);
    in_stack_ffffffffffffff80 = in_stack_00000010;
    in_stack_ffffffffffffff90 = in_stack_00000020;
    if (bVar1) {
      return true;
    }
  }
  mserialize::detail::remove_prefix_before
            ((string_view *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  str._ptr._7_1_ = in_stack_ffffffffffffff8f;
  str._ptr._0_7_ = in_stack_ffffffffffffff88;
  str._len = (size_t)in_stack_ffffffffffffff90;
  detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff80,str);
  bVar1 = mserialize::string_view::empty((string_view *)&stack0x00000018);
  if (bVar1) {
    in_RDI->_emptyStruct = true;
  }
  else {
    detail::OstreamBuffer::operator<<
              (in_stack_ffffffffffffff90,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    enterSeq(in_RDI);
  }
  return false;
}

Assistant:

bool ToStringVisitor::visit(mserialize::Visitor::StructBegin sb, Range& input)
{
  comma();

  if (_pp != nullptr && _pp->printStruct(_out, sb, input))
  {
    return true;
  }

  _out << mserialize::detail::remove_prefix_before(sb.name, '<');
  if (sb.tag.empty())
  {
    _emptyStruct = true;
  }
  else
  {
    _out << "{ ";
    enterSeq();
  }

  return false;
}